

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O3

void __thiscall
PolygonTriangulation::thread_endpoints
          (PolygonTriangulation *this,uint32_t segment_index,uint32_t max_y_index,
          uint32_t min_y_index)

{
  vertex_t *pvVar1;
  vertex_t *pvVar2;
  Trapezoid_t *trapezoid;
  Trapezoid_t *trapezoid_00;
  QNode_t *right_fusion_node;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  pointer pTVar6;
  pointer pQVar7;
  QNode_t *pQVar8;
  double dVar9;
  double dVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  bool bVar17;
  uint32_t trapezoid_index;
  uint32_t *puVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  vertex_t local_48;
  
  pvVar1 = this->vertices_ + min_y_index;
  pvVar2 = this->vertices_ + max_y_index;
  local_48.x = pvVar2->x;
  local_48.y = pvVar2->y;
  dVar9 = pvVar1->x - local_48.x;
  dVar10 = pvVar1->y - local_48.y;
  dVar21 = (1.0 / SQRT(dVar9 * dVar9 + dVar10 * dVar10)) * 0.001;
  local_48.x = dVar21 * dVar9 + local_48.x;
  local_48.y = dVar21 * dVar10 + local_48.y;
  trapezoid_index =
       search_trapezoid_index
                 (this,&local_48,
                  (this->vertex_ynodes_).
                  super__Vector_base<PolygonTriangulation::QNode_t_*,_std::allocator<PolygonTriangulation::QNode_t_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[max_y_index]);
  uVar3 = this->used_trapezoid_count_;
  uVar20 = (ulong)uVar3;
  this->used_trapezoid_count_ = uVar3 + 1;
  pTVar6 = (this->trapezoids_).
           super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  trapezoid = pTVar6 + trapezoid_index;
  trapezoid_00 = pTVar6 + uVar20;
  trapezoid_00->sink = trapezoid->sink;
  uVar13 = trapezoid->max_y;
  uVar14 = trapezoid->min_y;
  uVar15 = trapezoid->left_segment;
  uVar16 = trapezoid->right_segment;
  uVar4 = trapezoid->above2;
  uVar11 = trapezoid->below1;
  uVar12 = trapezoid->below2;
  trapezoid_00->above1 = trapezoid->above1;
  trapezoid_00->above2 = uVar4;
  trapezoid_00->below1 = uVar11;
  trapezoid_00->below2 = uVar12;
  trapezoid_00->max_y = uVar13;
  trapezoid_00->min_y = uVar14;
  trapezoid_00->left_segment = uVar15;
  trapezoid_00->right_segment = uVar16;
  if ((ulong)trapezoid->above2 == 0xffffffff) {
    puVar18 = &(this->trapezoids_).
               super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ._M_impl.super__Vector_impl_data._M_start[trapezoid->above1].below2;
    uVar4 = *puVar18;
    if ((uVar4 == 0xffffffff) ||
       ((trapezoid_index == uVar4 && (trapezoid->left_segment != 0xffffffff)))) {
      *puVar18 = uVar3;
    }
  }
  else {
    (this->trapezoids_).
    super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
    ._M_impl.super__Vector_impl_data._M_start[trapezoid->above2].below1 = uVar3;
    trapezoid_00->above1 = trapezoid->above2;
  }
  trapezoid->above2 = 0xffffffff;
  trapezoid_00->above2 = 0xffffffff;
  pQVar7 = (this->query_points_).
           super__Vector_base<PolygonTriangulation::QNode_t,_std::allocator<PolygonTriangulation::QNode_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar8 = this->root_;
  uVar5 = this->used_node_count_;
  this->used_node_count_ = uVar5 + 1;
  right_fusion_node = pQVar7 + uVar5;
  pQVar7[uVar5].type = SINK;
  pQVar7[uVar5].parent = pQVar8;
  pQVar7[uVar5].key_index = uVar3;
  (this->trapezoids_).
  super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
  ._M_impl.super__Vector_impl_data._M_start[uVar20].sink = right_fusion_node;
  if (pQVar8 == (QNode_t *)0x0) {
    this->root_ = right_fusion_node;
  }
  split_merge_trapezoids
            (this,segment_index,min_y_index,trapezoid_index,(QNode_t *)0x0,right_fusion_node);
  bVar17 = is_top_triangle(this,trapezoid);
  uVar19 = (ulong)trapezoid_index;
  if ((!bVar17) && (bVar17 = is_top_triangle(this,trapezoid_00), uVar19 = uVar20, !bVar17)) {
    return;
  }
  pTVar6[uVar19].above1 = 0xffffffff;
  return;
}

Assistant:

void PolygonTriangulation::thread_endpoints(
    const uint32_t segment_index,
    const uint32_t max_y_index,
    const uint32_t min_y_index
) {
  // Recursively split and merge trapezoids intersecting the segment.

  // To find the top trapezoid we need to offset the first vertex in the direction
  // of the segment, to distinct between left/right trapezoids neighbors.
  vertex_t v;
  compute_offset_vertex(max_y_index, min_y_index, v);

  /// @note could be constant instead, by storing two below sinks and a segment for each Y.
  /// furthermore this will prevent a bug when trapzeoid collapse (on same Ys).
  const auto top_trapezoid_index = search_trapezoid_index(v, vertex_ynodes_[max_y_index]); //
  const auto new_trapezoid_index = get_new_trapezoid_index();

  auto &top_trapezoid = trapezoids_[top_trapezoid_index];
  auto &new_trapezoid = trapezoids_[new_trapezoid_index];

  // Copy top trapezoid attributes to the new one.
  new_trapezoid = top_trapezoid;

  // Link first splitted trapezoid to the one above it.
  if (kInvalidIndex != top_trapezoid.above2) {
    trapezoids_[top_trapezoid.above2].below1 = new_trapezoid_index;
    new_trapezoid.above1 = top_trapezoid.above2;
  } else {
    auto &above_trapezoid = trapezoids_[top_trapezoid.above1];

    if (above_trapezoid.below2 == kInvalidIndex) {
      // case 1 : new empty trapezoid
      above_trapezoid.below2 = new_trapezoid_index;
    } else if (   (top_trapezoid_index == above_trapezoid.below2)
               && (kInvalidIndex != top_trapezoid.left_segment)) {
      // case 2 : old right trap will become a triangle
      above_trapezoid.below2 = new_trapezoid_index;
    }
  }
  top_trapezoid.above2 = kInvalidIndex;
  new_trapezoid.above2 = kInvalidIndex;

  // Every threading operation create one new sink, used as the right fusion sink
  // by default.
  auto *new_sink = create_node(SINK, root_, new_trapezoid_index);

#if DEBUG_INFO
  fprintf(stderr, "> split X : %d %d\n", max_y_index, min_y_index);
#endif
  split_merge_trapezoids(segment_index, min_y_index, top_trapezoid_index, nullptr, new_sink);

  // Close connections with above trapezoid when one of the start trapezoids
  // (left or right) is a triangle.
  if (is_top_triangle(top_trapezoid)) {
    top_trapezoid.above1 = kInvalidIndex;
  } else if (is_top_triangle(new_trapezoid)) {
    new_trapezoid.above1 = kInvalidIndex;
  }
}